

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::RegisterTests
          (ParameterizedTestSuiteInfo<P256NistzImplTest> *this)

{
  pointer psVar1;
  pointer pIVar2;
  ParamNameGeneratorFunc *pPVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
  _Var4;
  code *pcVar5;
  _Alloc_hider name;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  P256NistzImpl *value;
  ostream *poVar10;
  size_type sVar11;
  char *pcVar12;
  undefined4 extraout_var_02;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_03;
  long lVar13;
  P256NistzImpl *pPVar14;
  TestParamInfo<P256NistzImpl> *pTVar15;
  undefined8 *puVar16;
  pointer psVar17;
  byte bVar18;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<P256NistzImpl>_*,_false> local_1e8;
  char *local_1e0;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<P256NistzImpl>_*,_false> local_1d8;
  pointer local_1d0;
  size_t local_1c8;
  ParamGenerator<P256NistzImpl> generator;
  string param_name;
  string test_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  TestParamInfo<P256NistzImpl> local_f0;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  undefined4 extraout_var_01;
  
  bVar18 = 0;
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  bVar7 = false;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar17 = (this->tests_).
                 super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar1; psVar17 = psVar17 + 1
      ) {
    pIVar2 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1d0 = psVar17;
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pIVar2; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar3 = __lhs->name_func;
      local_1e0 = __lhs->file;
      iVar9 = __lhs->line;
      if ((__lhs->name)._M_string_length == 0) {
        test_suite_name._M_string_length = 0;
        *test_suite_name._M_dataplus._M_p = '\0';
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar8 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<P256NistzImpl>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_1e8._M_head_impl = (ParamIteratorInterface<P256NistzImpl> *)CONCAT44(extraout_var,iVar8)
      ;
      iVar8 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<P256NistzImpl>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
      local_1d8._M_head_impl =
           (ParamIteratorInterface<P256NistzImpl> *)CONCAT44(extraout_var_00,iVar8);
      local_1c8 = 0;
      while( true ) {
        bVar6 = ParamIterator<P256NistzImpl>::operator!=
                          ((ParamIterator<P256NistzImpl> *)&local_1e8,
                           (ParamIterator<P256NistzImpl> *)&local_1d8);
        if (!bVar6) break;
        iVar8 = (*(local_1e8._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        value = (P256NistzImpl *)CONCAT44(extraout_var_01,iVar8);
        test_name._M_string_length = 0;
        *test_name._M_dataplus._M_p = '\0';
        pPVar14 = value;
        pTVar15 = &local_f0;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pTVar15->param).name = pPVar14->name;
          pPVar14 = (P256NistzImpl *)((long)pPVar14 + (ulong)bVar18 * -0x10 + 8);
          pTVar15 = (TestParamInfo<P256NistzImpl> *)((long)pTVar15 + (ulong)bVar18 * -0x10 + 8);
        }
        local_f0.index = local_1c8;
        (*pPVar3)(&param_name,&local_f0);
        bVar7 = IsValidParamName(&param_name);
        bVar7 = IsTrue(bVar7);
        if (!bVar7) {
          GTestLog::GTestLog((GTestLog *)&local_f0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition IsValidParamName(param_name) failed. ");
          poVar10 = std::operator<<(poVar10,"Parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)&param_name);
          poVar10 = std::operator<<(poVar10,
                                    "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                   );
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10," line ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar9);
          poVar10 = std::operator<<(poVar10,"");
          std::endl<char,std::char_traits<char>>(poVar10);
          GTestLog::~GTestLog((GTestLog *)&local_f0);
        }
        sVar11 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar7 = IsTrue(sVar11 == 0);
        if (!bVar7) {
          GTestLog::GTestLog((GTestLog *)&local_f0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar10 = std::operator<<(poVar10,"Duplicate parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)&param_name);
          poVar10 = std::operator<<(poVar10,"\', in ");
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10," line ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar9);
          std::endl<char,std::char_traits<char>>(poVar10);
          GTestLog::~GTestLog((GTestLog *)&local_f0);
        }
        if ((((psVar17->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->test_base_name)._M_string_length != 0) {
          pcVar12 = (char *)std::__cxx11::string::append((string *)&test_name);
          std::__cxx11::string::append(pcVar12);
        }
        std::__cxx11::string::append((string *)&test_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        std::__cxx11::string::string((string *)&local_a0,(string *)&test_suite_name);
        name = test_name._M_dataplus;
        PrintToString<P256NistzImpl>((string *)&local_f0,value);
        pcVar12 = local_f0.param.name;
        CodeLocation::CodeLocation
                  (&local_58,
                   &((psVar17->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->code_location);
        iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        set_up_tc = SuiteApiResolver<P256NistzImplTest>::GetSetUpCaseOrSuite(local_1e0,iVar9);
        tear_down_tc = SuiteApiResolver<P256NistzImplTest>::GetTearDownCaseOrSuite(local_1e0,iVar9);
        _Var4.super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>.
        _M_head_impl = (((local_1d0->
                         super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->test_meta_factory)._M_t.
                       super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<P256NistzImpl>,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
                       .
                       super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
        ;
        pcVar5 = *(code **)(*(long *)_Var4.
                                     super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
                                     ._M_head_impl + 0x10);
        puVar16 = (undefined8 *)&stack0xfffffffffffffdc8;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar16 = value->name;
          value = (P256NistzImpl *)((long)value + (ulong)bVar18 * -0x10 + 8);
          puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
        }
        factory = (TestFactoryBase *)
                  (*pcVar5)(_Var4.
                            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
                            ._M_head_impl);
        MakeAndRegisterTestInfo
                  (&local_a0,name._M_p,(char *)0x0,pcVar12,&local_58,
                   (TypeId)CONCAT44(extraout_var_02,iVar8),set_up_tc,tear_down_tc,factory);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_a0);
        local_1c8 = local_1c8 + 1;
        std::__cxx11::string::~string((string *)&param_name);
        bVar7 = true;
        (*(local_1e8._M_head_impl)->_vptr_ParamIteratorInterface[3])();
        psVar17 = local_1d0;
      }
      if (local_1d8._M_head_impl != (ParamIteratorInterface<P256NistzImpl> *)0x0) {
        (*(local_1d8._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      if (local_1e8._M_head_impl != (ParamIteratorInterface<P256NistzImpl> *)0x0) {
        (*(local_1e8._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&test_param_names);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<P256NistzImpl>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  if (!bVar7) {
    iVar9 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      (this);
    CodeLocation::CodeLocation(&local_80,&this->code_location_);
    InsertSyntheticTestCase
              ((string *)CONCAT44(extraout_var_03,iVar9),&local_80,
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::~string((string *)&test_name);
  std::__cxx11::string::~string((string *)&test_suite_name);
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }